

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.h
# Opt level: O3

void __thiscall
uWS::TemplatedApp<false>::TemplatedApp
          (TemplatedApp<false> *this,us_socket_context_options_t options)

{
  Loop *loop;
  HttpContext<false> *pHVar1;
  
  (this->webSocketContexts).
  super__Vector_base<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->webSocketContexts).
  super__Vector_base<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->webSocketContexts).
  super__Vector_base<uWS::WebSocketContext<false,_true>_*,_std::allocator<uWS::WebSocketContext<false,_true>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loop = Loop::get((void *)0x0);
  pHVar1 = HttpContext<false>::create(loop,options);
  this->httpContext = pHVar1;
  return;
}

Assistant:

TemplatedApp(us_socket_context_options_t options = {}) {
        httpContext = uWS::HttpContext<SSL>::create(uWS::Loop::get(), options);
    }